

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arc.c
# Opt level: O3

error parse_simple(char *start,char *end,atom *result)

{
  char *pcVar1;
  long lVar2;
  int iVar3;
  error eVar4;
  char *__ptr;
  char cVar5;
  anon_union_8_9_1d3277aa_for_value aVar6;
  anon_union_8_9_1d3277aa_for_value aVar7;
  undefined8 uVar8;
  char *pcVar9;
  ulong uVar10;
  char *pcVar11;
  double dVar12;
  long lVar13;
  size_t sVar14;
  atom aVar15;
  atom car_val;
  atom car_val_00;
  atom car_val_01;
  atom car_val_02;
  atom car_val_03;
  atom cdr_val;
  atom cdr_val_00;
  atom cdr_val_01;
  atom a2;
  atom a1;
  atom a1_1;
  char *p;
  atom local_68;
  atom local_58;
  atom local_48;
  char *local_38;
  
  dVar12 = strtod(start,&local_38);
  if (local_38 == end) {
    result->type = T_NUM;
    (result->value).number = dVar12;
  }
  else {
    if (*start == '#') {
      sVar14 = (long)end - (long)start;
      pcVar9 = (char *)malloc(sVar14 + 1);
      memcpy(pcVar9,start,sVar14);
      pcVar9[sVar14] = '\0';
      if ((sVar14 != 3) || (pcVar9[1] != '\\')) {
        iVar3 = strcmp(pcVar9,"#\\nul");
        if (iVar3 == 0) {
          dVar12 = 0.0;
        }
        else {
          iVar3 = strcmp(pcVar9,"#\\return");
          if (iVar3 == 0) {
            dVar12 = 6.42285339593621e-323;
          }
          else {
            iVar3 = strcmp(pcVar9,"#\\newline");
            if (iVar3 == 0) {
              dVar12 = 4.94065645841247e-323;
            }
            else {
              iVar3 = strcmp(pcVar9,"#\\tab");
              if (iVar3 == 0) {
                dVar12 = 4.44659081257122e-323;
              }
              else {
                iVar3 = strcmp(pcVar9,"#\\space");
                if (iVar3 != 0) {
LAB_00104a1a:
                  free(pcVar9);
                  return ERROR_SYNTAX;
                }
                dVar12 = 1.58101006669199e-322;
              }
            }
          }
        }
        free(pcVar9);
        result->type = T_CHAR;
        (result->value).number = dVar12;
        return ERROR_OK;
      }
      aVar7._1_7_ = 0;
      aVar7.ch = pcVar9[2];
      result->type = T_CHAR;
      result->value = aVar7;
    }
    else {
      if (*start == '\"') {
        result->type = T_STRING;
        __ptr = (char *)malloc((size_t)(end + ~(ulong)start));
        pcVar1 = start + 1;
        pcVar9 = __ptr;
        while (pcVar11 = pcVar1, pcVar11 < end + -1) {
          cVar5 = start[1];
          if (cVar5 == '\\') {
            cVar5 = start[2];
            pcVar11 = start + 2;
            if (cVar5 == 't') {
              cVar5 = '\t';
            }
            else if (cVar5 == 'r') {
              cVar5 = '\r';
            }
            else if (cVar5 == 'n') {
              cVar5 = '\n';
            }
          }
          *pcVar9 = cVar5;
          pcVar9 = pcVar9 + 1;
          start = pcVar11;
          pcVar1 = pcVar11 + 1;
        }
        *pcVar9 = '\0';
        pcVar9 = (char *)realloc(__ptr,(size_t)(pcVar9 + (1 - (long)__ptr)));
        aVar15 = make_string(pcVar9);
        result->type = T_STRING;
        result->value = aVar15.value;
        return ERROR_OK;
      }
      sVar14 = (long)end - (long)start;
      pcVar9 = (char *)malloc(sVar14 + 1);
      memcpy(pcVar9,start,sVar14);
      pcVar9[sVar14] = '\0';
      iVar3 = strcmp(pcVar9,"nil");
      if (iVar3 == 0) {
        *(undefined8 *)result = 0;
        (result->value).number = 0.0;
      }
      else {
        if (((*pcVar9 != '.') || (pcVar9[1] != '\0')) && (0 < (long)sVar14)) {
          pcVar1 = pcVar9 + sVar14;
          lVar13 = 0;
          do {
            cVar5 = pcVar1[lVar13 + -1];
            if (cVar5 == '!') {
              if ((lVar13 == 0 || sVar14 + lVar13 == 1) ||
                 (eVar4 = parse_simple(pcVar9,pcVar9 + sVar14 + lVar13 + -1,&local_58),
                 eVar4 != ERROR_OK)) goto LAB_00104a1a;
              eVar4 = parse_simple(pcVar1 + lVar13,pcVar1,&local_68);
              free(pcVar9);
              if (eVar4 != ERROR_OK) {
                return ERROR_SYNTAX;
              }
              aVar15._4_4_ = 0;
              aVar15.type = local_68.type;
              aVar15.value.number = local_68.value.number;
              aVar15 = cons(aVar15,(atom)ZEXT816(0));
              car_val._4_4_ = 0;
              car_val.type = sym_quote.type;
              car_val.value.number = sym_quote.value.number;
              cdr_val.value.number = aVar15.value.number;
              cdr_val._0_8_ = 1;
              aVar15 = cons(car_val,cdr_val);
              local_68.value = aVar15.value;
              uVar10 = 1;
LAB_001049d1:
              car_val_00.value.number = local_68.value.number;
              car_val_00._0_8_ = uVar10;
              aVar15 = cons(car_val_00,(atom)ZEXT816(0));
              aVar7 = aVar15.value;
              uVar10 = (ulong)local_58.type;
              goto LAB_00104ab7;
            }
            if (cVar5 == ':') {
              if ((lVar13 == 0 || sVar14 + lVar13 == 1) ||
                 (eVar4 = parse_simple(pcVar9,pcVar9 + sVar14 + lVar13 + -1,&local_58),
                 eVar4 != ERROR_OK)) goto LAB_00104a1a;
              eVar4 = parse_simple(pcVar1 + lVar13,pcVar1,&local_68);
              free(pcVar9);
              if (eVar4 != ERROR_OK) {
                return ERROR_SYNTAX;
              }
              aVar15 = make_sym("compose");
              aVar6 = aVar15.value;
              car_val_01._4_4_ = 0;
              car_val_01.type = local_68.type;
              car_val_01.value.number = local_68.value.number;
              aVar15 = cons(car_val_01,(atom)ZEXT816(0));
              aVar7 = aVar15.value;
              uVar8 = 1;
              local_48.value = local_58.value;
              local_48.type = local_58.type;
              goto LAB_00104aa7;
            }
            if (cVar5 == '.') {
              if ((lVar13 != 0 && sVar14 + lVar13 != 1) &&
                 (eVar4 = parse_simple(pcVar9,pcVar9 + sVar14 + lVar13 + -1,&local_58),
                 eVar4 == ERROR_OK)) {
                eVar4 = parse_simple(pcVar1 + lVar13,pcVar1,&local_68);
                free(pcVar9);
                if (eVar4 != ERROR_OK) {
                  return ERROR_SYNTAX;
                }
                uVar10 = (ulong)local_68.type;
                goto LAB_001049d1;
              }
              goto LAB_00104a1a;
            }
            lVar2 = sVar14 + lVar13;
            lVar13 = lVar13 + -1;
          } while (0 < lVar2 + -1);
          if (*pcVar9 == '~' && sVar14 != 1) {
            eVar4 = parse_simple(pcVar9 + 1,pcVar1,&local_48);
            free(pcVar9);
            if (eVar4 != ERROR_OK) {
              return ERROR_SYNTAX;
            }
            aVar15 = make_sym("complement");
            aVar6 = aVar15.value;
            uVar8 = 0;
            aVar7.number = 0.0;
LAB_00104aa7:
            car_val_02._4_4_ = 0;
            car_val_02.type = local_48.type;
            car_val_02.value.number = local_48.value.number;
            cdr_val_00.value.number = aVar7.number;
            cdr_val_00._0_8_ = uVar8;
            aVar15 = cons(car_val_02,cdr_val_00);
            aVar7 = aVar15.value;
            uVar10 = 2;
            local_58.value = aVar6;
LAB_00104ab7:
            car_val_03.value.number = local_58.value.number;
            car_val_03._0_8_ = uVar10;
            cdr_val_01.value.number = aVar7.number;
            cdr_val_01._0_8_ = 1;
            aVar15 = cons(car_val_03,cdr_val_01);
            result->type = T_CONS;
            result->value = aVar15.value;
            return ERROR_OK;
          }
        }
        aVar15 = make_sym(pcVar9);
        result->type = T_SYM;
        result->value = aVar15.value;
      }
    }
    free(pcVar9);
  }
  return ERROR_OK;
}

Assistant:

error parse_simple(const char *start, const char *end, atom *result)
{
	char *p;

	/* Is it a number? */
	double val = strtod(start, &p);
	if (p == end) {
		result->type = T_NUM;
		result->value.number = val;
		return ERROR_OK;
	}
	else if (start[0] == '"') { /* "string" */
		result->type = T_STRING;
		size_t length = end - start - 2;
		char *buf = (char*)malloc(length + 1);
		const char *ps = start + 1;
		char *pt = buf;
		while (ps < end - 1) {
			if (*ps == '\\') {
				char c_next = *(ps + 1);
				switch (c_next) {
				case 'r':
					*pt = '\r';
					break;
				case 'n':
					*pt = '\n';
					break;
				case 't':
					*pt = '\t';
					break;
				default:
					*pt = c_next;
				}
				ps++;
			}
			else {
				*pt = *ps;
			}
			ps++;
			pt++;
		}
		*pt = 0;
		buf = realloc(buf, pt - buf + 1);
		*result = make_string(buf);
		return ERROR_OK;
	}
	else if (start[0] == '#') { /* #\char */
		char *buf = malloc(end - start + 1);
		memcpy(buf, start, end - start);
		buf[end - start] = 0;
		size_t length = end - start;
		if (length == 3 && buf[1] == '\\') { /* plain character e.g. #\a */
			*result = make_char(buf[2]);
			free(buf);
			return ERROR_OK;
		}
		else {
			char c;
			if (strcmp(buf, "#\\nul") == 0)
				c = '\0';
			else if (strcmp(buf, "#\\return") == 0)
				c = '\r';
			else if (strcmp(buf, "#\\newline") == 0)
				c = '\n';
			else if (strcmp(buf, "#\\tab") == 0)
				c = '\t';
			else if (strcmp(buf, "#\\space") == 0)
				c = ' ';
			else {
				free(buf);
				return ERROR_SYNTAX;
			}
			free(buf);
			*result = make_char(c);
			return ERROR_OK;
		}
	}

	/* NIL or symbol */
	char *buf = malloc(end - start + 1);
	memcpy(buf, start, end - start);
	buf[end - start] = 0;

	if (strcmp(buf, "nil") == 0)
		*result = nil;
	else if (strcmp(buf, ".") == 0)
		*result = make_sym(buf);
	else {
		atom a1, a2;
		long length = end - start, i;
		for (i = length - 1; i >= 0; i--) { /* left-associative */
			if (buf[i] == '.') { /* a.b => (a b) */
				if (i == 0 || i == length - 1) {
					free(buf);
					return ERROR_SYNTAX;
				}
				error err;
				err = parse_simple(buf, buf + i, &a1);
				if (err) {
					free(buf);
					return ERROR_SYNTAX;
				}
				err = parse_simple(buf + i + 1, buf + length, &a2);
				if (err) {
					free(buf);
					return ERROR_SYNTAX;
				}
				free(buf);
				*result = cons(a1, cons(a2, nil));
				return ERROR_OK;
			}
			else if (buf[i] == '!') { /* a!b => (a 'b) */
				if (i == 0 || i == length - 1) {
					free(buf);
					return ERROR_SYNTAX;
				}
				error err;
				err = parse_simple(buf, buf + i, &a1);
				if (err) {
					free(buf);
					return ERROR_SYNTAX;
				}
				err = parse_simple(buf + i + 1, buf + length, &a2);
				if (err) {
					free(buf);
					return ERROR_SYNTAX;
				}
				free(buf);
				*result = cons(a1, cons(cons(sym_quote, cons(a2, nil)), nil));
				return ERROR_OK;
			}
			else if (buf[i] == ':') { /* a:b => (compose a b) */
				if (i == 0 || i == length - 1) {
					free(buf);
					return ERROR_SYNTAX;
				}
				error err;
				err = parse_simple(buf, buf + i, &a1);
				if (err) {
					free(buf);
					return ERROR_SYNTAX;
				}
				err = parse_simple(buf + i + 1, buf + length, &a2);
				if (err) {
					free(buf);
					return ERROR_SYNTAX;
				}
				free(buf);
				*result = cons(make_sym("compose"), cons(a1, cons(a2, nil)));
				return ERROR_OK;
			}
		}
		if (length >= 2 && buf[0] == '~') { /* ~a => (complement a) */
			atom a1;
			error err = parse_simple(buf + 1, buf + length, &a1);
			free(buf);
			if (err) {
				return ERROR_SYNTAX;
			}
			*result = cons(make_sym("complement"), cons(a1, nil));
			return ERROR_OK;
		}
		*result = make_sym(buf);
	}

	free(buf);
	return ERROR_OK;
}